

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

Lf_Cut_t * Lf_ObjCutBest(Lf_Man_t *p,int i)

{
  uint uVar1;
  Lf_Bst_t *p_00;
  
  p_00 = Lf_ObjReadBest(p,i);
  uVar1 = Lf_BestCutIndex(p_00);
  Lf_ObjCutBest::CutSet[1]._0_4_ = p_00->Delay[uVar1];
  Lf_ObjCutBest::CutSet[1]._4_4_ = p_00->Flow[uVar1];
  if (uVar1 == 2) {
    Lf_MemLoadMuxCut(p,i,(Lf_Cut_t *)Lf_ObjCutBest::CutSet);
  }
  else {
    Lf_MemLoadCut(&p->vStoreOld,(uint)p_00->Cut[uVar1] >> 1,i,(Lf_Cut_t *)Lf_ObjCutBest::CutSet,
                  p->pPars->fCutMin,0);
  }
  return (Lf_Cut_t *)Lf_ObjCutBest::CutSet;
}

Assistant:

static inline Lf_Cut_t * Lf_ObjCutBest( Lf_Man_t * p, int i )
{
    static word CutSet[LF_CUT_WORDS];
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, i );
    Lf_Cut_t * pCut = (Lf_Cut_t *)CutSet;
    int Index = Lf_BestCutIndex( pBest );
    pCut->Delay = pBest->Delay[Index];
    pCut->Flow  = pBest->Flow[Index];
    if ( Index == 2 )
        return Lf_MemLoadMuxCut( p, i, pCut );
    return Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[Index].Handle, i, pCut, p->pPars->fCutMin, 0 );
}